

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Add_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int64 iVar4;
  int64 iVar5;
  JavascriptNumber *pJVar6;
  Var pvVar7;
  double dVar8;
  double dVar9;
  double sum_3;
  double sum_2;
  double sum_1;
  int64 sum;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17d,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17e,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (result == (JavascriptNumber *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x180,"(result != nullptr)","result != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    bVar2 = TaggedInt::Is(aRight);
    if (bVar2) {
      iVar4 = TaggedInt::ToInt64(aLeft);
      iVar5 = TaggedInt::ToInt64(aRight);
      pvVar7 = JavascriptNumber::ToVarInPlace(iVar4 + iVar5,scriptContext,result);
      return pvVar7;
    }
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight);
    if (bVar2) {
      dVar8 = TaggedInt::ToDouble(aLeft);
      dVar9 = JavascriptNumber::GetValue(aRight);
      pJVar6 = JavascriptNumber::InPlaceNew(dVar8 + dVar9,scriptContext,result);
      return pJVar6;
    }
  }
  else {
    bVar2 = TaggedInt::Is(aRight);
    if (bVar2) {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aLeft);
      if (bVar2) {
        dVar8 = JavascriptNumber::GetValue(aLeft);
        dVar9 = TaggedInt::ToDouble(aRight);
        pJVar6 = JavascriptNumber::InPlaceNew(dVar8 + dVar9,scriptContext,result);
        return pJVar6;
      }
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aLeft);
      if ((bVar2) && (bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight), bVar2)) {
        dVar8 = JavascriptNumber::GetValue(aLeft);
        dVar9 = JavascriptNumber::GetValue(aRight);
        pJVar6 = JavascriptNumber::InPlaceNew(dVar8 + dVar9,scriptContext,result);
        return pJVar6;
      }
    }
  }
  pvVar7 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,result,false);
  return pvVar7;
}

Assistant:

Var JavascriptMath::Add_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_AddInPlace);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);
            Assert(result != nullptr);

            // If both sides are numbers, then we can do the addition directly, otherwise
            // we need to call the helper.
            if( TaggedInt::Is(aLeft) )
            {
                if( TaggedInt::Is(aRight) )
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
#if INT32VAR
                    int64 sum = TaggedInt::ToInt64(aLeft) + TaggedInt::ToInt64(aRight);
#else
                    int32 sum = TaggedInt::ToInt32(aLeft) + TaggedInt::ToInt32(aRight);
#endif

                    return JavascriptNumber::ToVarInPlace(sum, scriptContext, result);
                }
                else if( JavascriptNumber::Is_NoTaggedIntCheck(aRight) )
                {
                    double sum = TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
                }
            }
            else if( TaggedInt::Is(aRight) )
            {
                if( JavascriptNumber::Is_NoTaggedIntCheck(aLeft) )
                {
                    double sum = JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight);
                    return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
                }
            }
            else if( JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight) )
            {
                double sum = JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight);
                return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
            }

            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, result, false);
            JIT_HELPER_END(Op_AddInPlace);
        }